

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 vdbeRecordDecodeInt(u32 serial_type,u8 *aKey)

{
  u64 x;
  u32 y;
  u8 *aKey_local;
  ulong uStack_10;
  u32 serial_type_local;
  
  switch(serial_type) {
  case 0:
  case 1:
    uStack_10 = (ulong)(char)*aKey;
    break;
  case 2:
    uStack_10 = (ulong)(int)CONCAT11(*aKey,aKey[1]);
    break;
  case 3:
    uStack_10 = (ulong)(int)((int)(char)*aKey << 0x10 | (uint)aKey[1] << 8 | (uint)aKey[2]);
    break;
  case 4:
    uStack_10 = (ulong)(int)((uint)*aKey << 0x18 | (uint)aKey[1] << 0x10 | (uint)aKey[2] << 8 |
                            (uint)aKey[3]);
    break;
  case 5:
    uStack_10 = CONCAT44((int)CONCAT11(*aKey,aKey[1]),
                         (uint)aKey[2] << 0x18 | (uint)aKey[3] << 0x10 | (uint)aKey[4] << 8 |
                         (uint)aKey[5]);
    break;
  case 6:
    uStack_10 = CONCAT44((uint)*aKey << 0x18 | (uint)aKey[1] << 0x10 | (uint)aKey[2] << 8 |
                         (uint)aKey[3],
                         (uint)aKey[4] << 0x18 | (uint)aKey[5] << 0x10 | (uint)aKey[6] << 8 |
                         (uint)aKey[7]);
    break;
  default:
    uStack_10 = (ulong)(serial_type - 8);
  }
  return uStack_10;
}

Assistant:

static i64 vdbeRecordDecodeInt(u32 serial_type, const u8 *aKey){
  u32 y;
  assert( CORRUPT_DB || (serial_type>=1 && serial_type<=9 && serial_type!=7) );
  switch( serial_type ){
    case 0:
    case 1:
      testcase( aKey[0]&0x80 );
      return ONE_BYTE_INT(aKey);
    case 2:
      testcase( aKey[0]&0x80 );
      return TWO_BYTE_INT(aKey);
    case 3:
      testcase( aKey[0]&0x80 );
      return THREE_BYTE_INT(aKey);
    case 4: {
      testcase( aKey[0]&0x80 );
      y = FOUR_BYTE_UINT(aKey);
      return (i64)*(int*)&y;
    }
    case 5: {
      testcase( aKey[0]&0x80 );
      return FOUR_BYTE_UINT(aKey+2) + (((i64)1)<<32)*TWO_BYTE_INT(aKey);
    }
    case 6: {
      u64 x = FOUR_BYTE_UINT(aKey);
      testcase( aKey[0]&0x80 );
      x = (x<<32) | FOUR_BYTE_UINT(aKey+4);
      return (i64)*(i64*)&x;
    }
  }

  return (serial_type - 8);
}